

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool server::restorescore(clientinfo *ci)

{
  int iVar1;
  int iVar2;
  int iVar3;
  savedscore *psVar4;
  
  psVar4 = findscore(ci,false);
  if (psVar4 != (savedscore *)0x0) {
    iVar1 = psVar4->flags;
    iVar2 = psVar4->deaths;
    iVar3 = psVar4->teamkills;
    (ci->state).frags = psVar4->frags;
    (ci->state).flags = iVar1;
    (ci->state).deaths = iVar2;
    (ci->state).teamkills = iVar3;
    iVar1 = psVar4->damage;
    (ci->state).shotdamage = psVar4->shotdamage;
    (ci->state).damage = iVar1;
    (ci->state).timeplayed = psVar4->timeplayed;
    (ci->state).effectiveness = psVar4->effectiveness;
  }
  return psVar4 != (savedscore *)0x0;
}

Assistant:

bool restorescore(clientinfo *ci)
    {
        //if(ci->local) return false;
        savedscore *sc = findscore(ci, false);
        if(sc)
        {
            sc->restore(ci->state);
            return true;
        }
        return false;
    }